

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O1

vector<CSegment_*,_std::allocator<CSegment_*>_> * __thiscall
CWire::Bend(vector<CSegment_*,_std::allocator<CSegment_*>_> *__return_storage_ptr__,CWire *this,
           int iX1,int iY1,int iX2,int iY2,int iZ1,int iZ2,int iZ3)

{
  pointer *pppCVar1;
  iterator iVar2;
  CSegment *pSegment;
  CSegment *local_48;
  CSegment *local_40;
  CSegment *local_38;
  
  (__return_storage_ptr__->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = CSegment::New();
  local_48 = CSegment::New();
  local_40 = CSegment::New();
  if (local_38 == (CSegment *)0x0) {
    __assert_fail("pSegment",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x42b,"vector<CSegment *> CWire::Bend(int, int, int, int, int, int, int)");
  }
  if (local_48 != (CSegment *)0x0) {
    if (local_40 != (CSegment *)0x0) {
      CSegment::Initialize
                (local_38,(int)this->m_pPointS->m_iX,(int)this->m_pPointS->m_iY,iX1,iY1,iZ1,this);
      CSegment::Initialize(local_48,iX1,iY1,iX2,iY2,iZ2,this);
      CSegment::Initialize
                (local_40,iX2,iY2,(int)this->m_pPointE->m_iX,(int)this->m_pPointE->m_iY,iZ3,this);
      iVar2._M_current =
           (__return_storage_ptr__->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<CSegment*,std::allocator<CSegment*>>::_M_realloc_insert<CSegment*const&>
                  ((vector<CSegment*,std::allocator<CSegment*>> *)__return_storage_ptr__,iVar2,
                   &local_38);
      }
      else {
        *iVar2._M_current = local_38;
        pppCVar1 = &(__return_storage_ptr__->
                    super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppCVar1 = *pppCVar1 + 1;
      }
      iVar2._M_current =
           (__return_storage_ptr__->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<CSegment*,std::allocator<CSegment*>>::_M_realloc_insert<CSegment*const&>
                  ((vector<CSegment*,std::allocator<CSegment*>> *)__return_storage_ptr__,iVar2,
                   &local_48);
      }
      else {
        *iVar2._M_current = local_48;
        pppCVar1 = &(__return_storage_ptr__->
                    super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppCVar1 = *pppCVar1 + 1;
      }
      iVar2._M_current =
           (__return_storage_ptr__->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<CSegment*,std::allocator<CSegment*>>::_M_realloc_insert<CSegment*const&>
                  ((vector<CSegment*,std::allocator<CSegment*>> *)__return_storage_ptr__,iVar2,
                   &local_40);
      }
      else {
        *iVar2._M_current = local_40;
        pppCVar1 = &(__return_storage_ptr__->
                    super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppCVar1 = *pppCVar1 + 1;
      }
      return __return_storage_ptr__;
    }
    __assert_fail("pNNSegment",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x42d,"vector<CSegment *> CWire::Bend(int, int, int, int, int, int, int)");
  }
  __assert_fail("pNSegment",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                ,0x42c,"vector<CSegment *> CWire::Bend(int, int, int, int, int, int, int)");
}

Assistant:

vector<CSegment*> CWire::Bend(int iX1, int iY1, int iX2, int iY2, int iZ1, int iZ2, int iZ3)
{
	vector<CSegment*>	Candidate;

	CSegment*	pSegment	=	CSegment::New();//new	CSegment;
	CSegment*	pNSegment	=	CSegment::New();//new	CSegment;
	CSegment*	pNNSegment	=	CSegment::New();//new	CSegment;
	
	assert(pSegment);
	assert(pNSegment);
	assert(pNNSegment);
	
	pSegment->Initialize(m_pPointS->X(),m_pPointS->Y(),iX1,iY1,iZ1,this);
	pNSegment->Initialize(iX1,iY1,iX2,iY2,iZ2,this);
	pNNSegment->Initialize(iX2,iY2,m_pPointE->X(),m_pPointE->Y(),iZ3,this);
	
	Candidate.push_back(pSegment);
	Candidate.push_back(pNSegment);
	Candidate.push_back(pNNSegment);
	
	return	Candidate;
}